

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O1

void add_action(Grammar *g,State *s,uint akind,Term *aterm,Rule *arule,State *astate)

{
  uint uVar1;
  uint uVar2;
  Action *pAVar3;
  ulong uVar4;
  Action **ppAVar5;
  VecAction *v;
  long lVar6;
  ulong uVar7;
  Action **ppAVar8;
  
  if (akind == 2) {
    uVar1 = (s->reduce_actions).n;
    if (uVar1 != 0) {
      lVar6 = 0;
      do {
        if ((s->reduce_actions).v[lVar6]->rule == arule) {
          return;
        }
        lVar6 = lVar6 + 1;
      } while (uVar1 != (uint)lVar6);
    }
    pAVar3 = new_Action(g,2,aterm,arule,astate);
    ppAVar5 = (s->reduce_actions).v;
    ppAVar8 = (s->reduce_actions).e;
    if (ppAVar5 == (Action **)0x0) {
      (s->reduce_actions).v = ppAVar8;
      uVar2 = (s->reduce_actions).n;
      (s->reduce_actions).n = uVar2 + 1;
      (s->reduce_actions).e[uVar2] = pAVar3;
      return;
    }
    v = &s->reduce_actions;
  }
  else {
    uVar4 = (ulong)(s->shift_actions).n;
    if (uVar4 != 0) {
      uVar7 = 0;
      do {
        pAVar3 = (s->shift_actions).v[uVar7];
        if (((pAVar3->term == aterm) && (pAVar3->state == astate)) && (pAVar3->kind == ACTION_SHIFT)
           ) {
          return;
        }
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    pAVar3 = new_Action(g,1,aterm,arule,astate);
    ppAVar5 = (s->shift_actions).v;
    ppAVar8 = (s->shift_actions).e;
    if (ppAVar5 == (Action **)0x0) {
      (s->shift_actions).v = ppAVar8;
      uVar2 = (s->shift_actions).n;
      (s->shift_actions).n = uVar2 + 1;
      (s->shift_actions).e[uVar2] = pAVar3;
      return;
    }
    v = &s->shift_actions;
  }
  uVar2 = v->n;
  if (ppAVar5 == ppAVar8) {
    if (2 < uVar2) goto LAB_001428f1;
  }
  else if ((uVar2 & 7) == 0) {
LAB_001428f1:
    vec_add_internal(v,pAVar3);
    return;
  }
  v->n = uVar2 + 1;
  ppAVar5[uVar2] = pAVar3;
  return;
}

Assistant:

static void add_action(Grammar *g, State *s, uint akind, Term *aterm, Rule *arule, State *astate) {
  uint i;
  Action *a;

  if (akind == ACTION_REDUCE) {
    /* eliminate duplicates */
    for (i = 0; i < s->reduce_actions.n; i++)
      if (s->reduce_actions.v[i]->rule == arule) return;
    a = new_Action(g, akind, aterm, arule, astate);
    vec_add(&s->reduce_actions, a);
  } else {
    /* eliminate duplicates */
    for (i = 0; i < s->shift_actions.n; i++)
      if (s->shift_actions.v[i]->term == aterm && s->shift_actions.v[i]->state == astate &&
          s->shift_actions.v[i]->kind == akind)
        return;
    a = new_Action(g, akind, aterm, arule, astate);
    vec_add(&s->shift_actions, a);
  }
}